

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
* docopt::docopt_parse
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
             *__return_storage_ptr__,string *doc,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *argv,bool help,bool version,bool options_first)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  element_type *peVar3;
  pointer this;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  iter;
  pointer psVar4;
  int iVar5;
  Pattern *pPVar6;
  key_type *__k;
  mapped_type *pmVar7;
  undefined4 extraout_var;
  DocoptArgumentError *pDVar8;
  undefined3 in_register_00000081;
  undefined4 uVar9;
  undefined4 in_register_00000084;
  shared_ptr<docopt::LeafPattern> *p;
  _Alloc_hider _Var10;
  pointer psVar11;
  allocator local_14d;
  undefined4 local_14c;
  PatternList argv_patterns;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  collected;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<docopt::Option,_std::allocator<docopt::Option>_> options;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string leftover;
  Required pattern;
  Tokens local_58;
  
  uVar9 = CONCAT31(in_register_00000081,version);
  local_14c = uVar9;
  Required::Required(&pattern);
  options.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  options.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  options.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  create_pattern_tree((pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                       *)&leftover,doc);
  local_d0._M_dataplus._M_p = (pointer)&options;
  local_d0._M_string_length = (size_type)&pattern;
  std::tuple<docopt::Required&,std::vector<docopt::Option,std::allocator<docopt::Option>>&>::
  operator=((tuple<docopt::Required&,std::vector<docopt::Option,std::allocator<docopt::Option>>&> *)
            &local_d0,
            (pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_> *
            )&leftover);
  std::pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>::~pair
            ((pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
              *)&leftover);
  argv_patterns.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  argv_patterns.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  argv_patterns.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_108,argv);
  local_58.fTokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_108.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_58.fTokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_108.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.fTokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_108.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.fIndex = 0;
  local_58.fIsParsingArgv = true;
  parse_argv((PatternList *)&leftover,&local_58,&options,options_first);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::_M_move_assign(&argv_patterns,&leftover);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)&leftover);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.fTokens);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  extras(help,local_14c._0_1_,&argv_patterns);
  collected.
  super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  collected.
  super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  collected.
  super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar6 = BranchPattern::fix(&pattern.super_BranchPattern);
  iVar5 = (*pPVar6->_vptr_Pattern[2])(pPVar6,&argv_patterns,&collected);
  if ((char)iVar5 == '\0') {
    pDVar8 = (DocoptArgumentError *)__cxa_allocate_exception(0x10);
    DocoptArgumentError::runtime_error(pDVar8,"Arguments did not match expected patterns");
    __cxa_throw(pDVar8,&DocoptArgumentError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (argv_patterns.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      argv_patterns.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    Pattern::leaves((vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_> *)
                    &leftover,(Pattern *)&pattern);
    for (_Var10 = leftover._M_dataplus; _Var10._M_p != (pointer)leftover._M_string_length;
        _Var10._M_p = _Var10._M_p + 8) {
      plVar2 = *(long **)_Var10._M_p;
      __k = (key_type *)(**(code **)(*plVar2 + 0x18))(plVar2);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
               ::operator[](__return_storage_ptr__,__k);
      value::operator=(pmVar7,(value *)(plVar2 + 5));
    }
    std::_Vector_base<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_>::~_Vector_base
              ((_Vector_base<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_> *)
               &leftover);
    psVar4 = collected.
             super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar11 = collected.
                   super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar4;
        psVar11 = psVar11 + 1) {
      peVar3 = (psVar11->super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      iVar5 = (*(peVar3->super_Pattern)._vptr_Pattern[3])(peVar3);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)CONCAT44(extraout_var,iVar5));
      value::operator=(pmVar7,&peVar3->fValue);
    }
    std::
    vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ::~vector(&collected);
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector(&argv_patterns);
    std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector(&options);
    BranchPattern::~BranchPattern(&pattern.super_BranchPattern);
    return __return_storage_ptr__;
  }
  this = (argv->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  iter._M_current =
       (argv->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string((string *)&local_d0,", ",&local_14d);
  (anonymous_namespace)::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&leftover,(_anonymous_namespace_ *)this,iter,&local_d0,
             (string *)CONCAT44(in_register_00000084,uVar9));
  std::__cxx11::string::~string((string *)&local_d0);
  pDVar8 = (DocoptArgumentError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_d0,"Unexpected argument: ",&leftover);
  DocoptArgumentError::runtime_error(pDVar8,&local_d0);
  __cxa_throw(pDVar8,&DocoptArgumentError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::map<std::string, value>
docopt::docopt_parse(std::string const& doc,
		     std::vector<std::string> const& argv,
		     bool help,
		     bool version,
		     bool options_first)
{
	//std::cout << "doc: " << doc << std::endl;
	//std::cout << "argv: " << argv << std::endl;
	
	Required pattern;
	std::vector<Option> options;
	try {
		std::tie(pattern, options) = create_pattern_tree(doc);
	} catch (Tokens::OptionError const& error) {
		throw DocoptLanguageError(error.what());
	}
	
	PatternList argv_patterns;
	try {
		argv_patterns = parse_argv(Tokens(argv), options, options_first);
	} catch (Tokens::OptionError const& error) {
		throw DocoptArgumentError(error.what());
	}
	
	extras(help, version, argv_patterns);
	
	std::vector<std::shared_ptr<LeafPattern>> collected;
	bool matched = pattern.fix().match(argv_patterns, collected);
	if (matched && argv_patterns.empty()) {
		std::map<std::string, value> ret;
		
		// (a.name, a.value) for a in (pattern.flat() + collected)
		for (auto* p : pattern.leaves()) {
			ret[p->name()] = p->getValue();
		}
		
		for (auto const& p : collected) {
			ret[p->name()] = p->getValue();
		}
		
		return ret;
	}
	
	if (matched) {
		std::string leftover = join(argv.begin(), argv.end(), ", ");
		throw DocoptArgumentError("Unexpected argument: " + leftover);
	}
	
	throw DocoptArgumentError("Arguments did not match expected patterns"); // BLEH. Bad error.
}